

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrim<tinyusdz::GeomCone>
          (Impl *this,Specifier *spec,Node *node,PathIndexToSpecIndexMap *psmap,GeomCone *prim)

{
  bool bVar1;
  ostream *poVar2;
  PrimReconstructOptions reconstruct_options;
  PropertyMap properties;
  ReferenceList refs;
  string local_1e8;
  PropertyMap local_1c8;
  ReferenceList local_198 [3];
  ios_base local_128 [264];
  
  local_1c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1c8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1c8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1c8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1c8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = BuildPropertyMap(this,&node->_children,psmap,&local_1c8);
  if (bVar1) {
    local_198[0].first = ResetToExplicit;
    local_198[0].second.
    super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_198[0].second.
    super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198[0].second.
    super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e8._M_dataplus._M_p._0_1_ = (this->_config).strict_allowedToken_check;
    bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCone>
                      (spec,&local_1c8,local_198,prim,&this->_warn,&this->_err,
                       (PrimReconstructOptions *)&local_1e8);
    ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::~vector
              (&local_198[0].second);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[USDC]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"ReconstructPrim",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<(local_198,0x5dc);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Failed to build PropertyMap.",0x1c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_) !=
        &local_1e8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1e8._M_dataplus._M_p._1_7_,local_1e8._M_dataplus._M_p._0_1_),
                      local_1e8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    ::std::ios_base::~ios_base(local_128);
    bVar1 = false;
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              *)&local_1c8,
             (_Link_type)local_1c8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar1;
}

Assistant:

bool USDCReader::Impl::ReconstructPrim(const Specifier &spec, const crate::CrateReader::Node &node,
                                       const PathIndexToSpecIndexMap &psmap,
                                       T *prim) {
  // Prim's properties are stored in its children nodes.
  prim::PropertyMap properties;
  if (!BuildPropertyMap(node.GetChildren(), psmap, &properties)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to build PropertyMap.");
  }

  prim::ReferenceList refs;  // dummy

  prim::PrimReconstructOptions reconstruct_options;
  reconstruct_options.strict_allowedToken_check = _config.strict_allowedToken_check;

  if (!prim::ReconstructPrim<T>(spec, properties, refs, prim, &_warn, &_err, reconstruct_options)) {
    return false;
  }

  return true;
}